

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool absl::lts_20240722::str_format_internal::ConvertIntArg<absl::lts_20240722::int128>
               (int128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  FormatSinkImpl *in_RCX;
  long lVar5;
  FormatSinkImpl *in_R8;
  FormatSinkImpl *sink_00;
  uint uVar7;
  double v_00;
  uint128 v_01;
  uint128 v_02;
  string_view v_03;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  undefined8 local_58;
  uint local_50;
  IntDigits local_48;
  FormatSinkImpl *pFVar6;
  
  uVar3 = CONCAT44((int)((ulong)register0x00000030 >> 0x20),conv.precision_);
  sink_00 = conv._0_8_;
  local_50 = (uint)in_RCX;
  conv_00.precision_ = (int)in_R8;
  local_58 = sink;
  switch((ulong)sink & 0xff) {
  case 0:
    local_58._2_1_ = (LengthMod)((ulong)sink >> 0x10);
    if (local_58._2_1_ != l) {
      conv_02.precision_ = conv_00.precision_;
      conv_02._0_8_ = sink;
      anon_unknown_53::ConvertCharImpl(conv.conv_,conv_02,in_RCX);
      return true;
    }
    conv_00._0_8_ = (ulong)in_RCX & 0xffffffff;
    bVar2 = anon_unknown_53::ConvertWCharTImpl
                      ((anon_unknown_53 *)((ulong)sink_00 & 0xffffffff),(wchar_t)sink,conv_00,
                       sink_00);
    return bVar2;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::int128]"
                 );
  case 2:
  case 3:
  case 0x12:
    uVar4 = -(ulong)(sink_00 != (FormatSinkImpl *)0x0) - uVar3;
    pFVar6 = (FormatSinkImpl *)-(long)sink_00;
    if (-1 < register0x00000030) {
      uVar4 = uVar3;
      pFVar6 = sink_00;
    }
    bVar2 = SUB81((ulong)register0x00000030 >> 0x3f,0);
    uVar3 = uVar4;
    break;
  case 4:
    lVar5 = 0;
    do {
      do {
        bVar1 = (byte)sink_00;
        sink_00 = (FormatSinkImpl *)((ulong)sink_00 >> 3 | uVar3 << 0x3d);
        local_48.storage_[lVar5 + 0x2b] = bVar1 & 7 | 0x30;
        uVar4 = uVar3 >> 3;
        lVar5 = lVar5 + -1;
        bVar2 = 7 < uVar3;
        uVar3 = uVar4;
      } while (bVar2);
    } while (sink_00 != (FormatSinkImpl *)0x0);
    sink_00 = (FormatSinkImpl *)0x0;
    goto LAB_00109fcf;
  case 5:
    bVar2 = false;
    pFVar6 = sink_00;
    break;
  case 6:
    v_02.hi_ = uVar3;
    v_02.lo_ = (uint64_t)sink_00;
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20240722::uint128>(&local_48,v_02);
    goto LAB_0010a00e;
  case 7:
    lVar5 = 0;
    do {
      do {
        uVar7 = (uint)sink_00;
        sink_00 = (FormatSinkImpl *)((ulong)sink_00 >> 4 | uVar3 << 0x3c);
        local_48.storage_[lVar5 + 0x2b] = "0123456789ABCDEF"[uVar7 & 0xf];
        uVar4 = uVar3 >> 4;
        lVar5 = lVar5 + -1;
        bVar2 = 0xf < uVar3;
        uVar3 = uVar4;
      } while (bVar2);
    } while (sink_00 != (FormatSinkImpl *)0x0);
LAB_00109fcf:
    local_48.start_ = local_48.storage_ + lVar5 + 0x2c;
    local_48.size_ = -lVar5;
    goto LAB_0010a00e;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    v_00 = (double)__floattidf(sink_00,uVar3);
    bVar2 = ConvertFloatImpl(v_00,(FormatConversionSpecImpl *)&local_58,in_R8);
    return bVar2;
  }
  v_01.hi_ = uVar3;
  v_01.lo_ = (uint64_t)pFVar6;
  anon_unknown_53::IntDigits::PrintAsDec(&local_48,v_01,bVar2);
LAB_0010a00e:
  if (local_58._1_1_ == kBasic) {
    v_03._M_str = local_48.start_;
    v_03._M_len = local_48.size_;
    FormatSinkImpl::Append(in_R8,v_03);
  }
  else {
    conv_01.width_ = 0;
    conv_01.conv_ = (undefined1)local_50;
    conv_01.flags_ = local_50._1_1_;
    conv_01.length_mod_ = local_50._2_1_;
    conv_01._3_1_ = local_50._3_1_;
    conv_01.precision_ = conv_00.precision_;
    anon_unknown_53::ConvertIntImplInnerSlow
              ((anon_unknown_53 *)&local_48,(IntDigits *)local_58,conv_01,sink_00);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}